

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizardPrivate::updateButtonLayout(QWizardPrivate *this)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  long lVar4;
  WizardButton *__value;
  long in_FS_OFFSET;
  QVarLengthArray<QWizard::WizardButton,_9LL> array;
  back_insert_iterator<QVarLengthArray<QWizard::WizardButton,_9LL>_> local_80;
  undefined1 local_78 [24];
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->buttonsHaveCustomLayout == true) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    __value = (this->buttonsCustomLayout).d.ptr;
    lVar4 = (this->buttonsCustomLayout).d.size;
    local_78._0_8_ = 9;
    local_78._8_4_ = 0;
    local_78._12_4_ = 0;
    local_78._16_8_ = &puStack_60;
    if (9 < lVar4) {
      QVLABase<QWizard::WizardButton>::reallocate_impl
                ((QVLABase<QWizard::WizardButton> *)local_78,9,&puStack_60,0,lVar4);
    }
    local_80.container = (QVarLengthArray<QWizard::WizardButton,_9LL> *)local_78;
    if (0 < lVar4) {
      lVar4 = lVar4 + 1;
      do {
        std::back_insert_iterator<QVarLengthArray<QWizard::WizardButton,_9LL>_>::operator=
                  (&local_80,__value);
        __value = __value + 1;
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    setButtonLayout(this,(WizardButton *)local_78._16_8_,local_78._8_4_);
    if ((undefined1 **)local_78._16_8_ != &puStack_60) {
      QtPrivate::sizedFree((void *)local_78._16_8_,local_78._0_8_ << 2);
    }
  }
  else {
    local_78._0_4_ = NoButton;
    local_78._8_4_ = -1;
    local_78._12_4_ = 0xffffffff;
    local_78._16_8_ = (undefined1 **)0xffffffffffffffff;
    uStack_50 = (undefined1 *)0xffffffffffffffff;
    uVar1 = (this->opts).super_QFlagsStorageHelper<QWizard::WizardOption,_4>.
            super_QFlagsStorage<QWizard::WizardOption>.i;
    if ((uVar1 >> 0xb & 1) != 0) {
      puVar3 = (undefined4 *)local_78;
      if ((uVar1 >> 0xc & 1) != 0) {
        puVar3 = (undefined4 *)((long)&uStack_50 + 4);
      }
      *puVar3 = 5;
    }
    local_78._4_4_ = 9;
    if ((uVar1 >> 0xd & 1) != 0) {
      local_78._8_4_ = 6;
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      local_78._12_4_ = 7;
    }
    if ((short)uVar1 < 0) {
      local_78._16_4_ = 8;
    }
    if ((uVar1 >> 9 & 1) == 0) {
      puVar2 = (undefined8 *)(local_78 + 0x14);
      if ((uVar1 >> 10 & 1) == 0) {
        puVar2 = &uStack_50;
      }
      *(undefined4 *)puVar2 = 4;
    }
    puStack_60 = (undefined1 *)0x100000000;
    local_58 = (undefined1 *)0x300000002;
    setButtonLayout(this,(WizardButton *)local_78,0xc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizardPrivate::updateButtonLayout()
{
    if (buttonsHaveCustomLayout) {
        QVarLengthArray<QWizard::WizardButton, QWizard::NButtons> array{
                buttonsCustomLayout.cbegin(), buttonsCustomLayout.cend()};
        setButtonLayout(array.constData(), int(array.size()));
    } else {
        // Positions:
        //     Help Stretch Custom1 Custom2 Custom3 Cancel Back Next Commit Finish Cancel Help

        const int ArraySize = 12;
        QWizard::WizardButton array[ArraySize];
        memset(array, -1, sizeof(array));
        Q_ASSERT(array[0] == QWizard::NoButton);

        if (opts & QWizard::HaveHelpButton) {
            int i = (opts & QWizard::HelpButtonOnRight) ? 11 : 0;
            array[i] = QWizard::HelpButton;
        }
        array[1] = QWizard::Stretch;
        if (opts & QWizard::HaveCustomButton1)
            array[2] = QWizard::CustomButton1;
        if (opts & QWizard::HaveCustomButton2)
            array[3] = QWizard::CustomButton2;
        if (opts & QWizard::HaveCustomButton3)
            array[4] = QWizard::CustomButton3;

        if (!(opts & QWizard::NoCancelButton)) {
            int i = (opts & QWizard::CancelButtonOnLeft) ? 5 : 10;
            array[i] = QWizard::CancelButton;
        }
        array[6] = QWizard::BackButton;
        array[7] = QWizard::NextButton;
        array[8] = QWizard::CommitButton;
        array[9] = QWizard::FinishButton;

        setButtonLayout(array, ArraySize);
    }
}